

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O1

int __thiscall QtMWidgets::TableViewCellPrivate::init(TableViewCellPrivate *this,EVP_PKEY_CTX *ctx)

{
  TableViewCell *pTVar1;
  undefined8 uVar2;
  ColorGroup CVar3;
  int iVar4;
  long *plVar5;
  TableViewCellLayout *this_00;
  MinimumSizeLabel *this_01;
  TextLabel *pTVar6;
  QWidget *pQVar7;
  QFont f;
  QTextOption opt;
  QFont local_40 [16];
  QFrame local_30 [24];
  
  pTVar1 = this->q;
  FingerGeometry::height();
  QWidget::setMinimumHeight((int)pTVar1);
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->q,0));
  QWidget::setBackgroundRole((ColorRole)this->q);
  QWidget::setAutoFillBackground(SUB81(this->q,0));
  CVar3 = QWidget::palette();
  plVar5 = (long *)QPalette::brush(CVar3,Dark);
  uVar2 = *(undefined8 *)(*plVar5 + 0xe);
  *(undefined8 *)&this->highlightColor = *(undefined8 *)(*plVar5 + 8);
  *(undefined8 *)((long)&(this->highlightColor).ct + 2) = uVar2;
  QColor::setAlpha((int)this + 0x38);
  this_00 = (TableViewCellLayout *)operator_new(0x40);
  TableViewCellLayout::TableViewCellLayout(this_00,&this->q->super_QWidget);
  this->layout = this_00;
  QLayout::setContentsMargins((int)this_00,3,3,3);
  this_01 = (MinimumSizeLabel *)operator_new(0x28);
  MinimumSizeLabel::MinimumSizeLabel(this_01,&this->q->super_QWidget);
  this->imageLabel = this_01;
  QLabel::setAlignment(this_01,0x84);
  QLabel::setWordWrap(SUB81(this->imageLabel,0));
  this->layout->imageLabel = this->imageLabel;
  QLayout::update();
  pTVar6 = (TextLabel *)operator_new(0x30);
  TextLabel::TextLabel(pTVar6,&this->q->super_QWidget,(WindowFlags)0x0);
  this->textLabel = pTVar6;
  TextLabel::textOption((TextLabel *)local_30);
  local_30[0] = (QFrame)((byte)local_30[0] | 0x80);
  TextLabel::setTextOption(this->textLabel,(QTextOption *)local_30);
  this->layout->textLabel = this->textLabel;
  QLayout::update();
  QTextOption::~QTextOption((QTextOption *)local_30);
  pTVar6 = (TextLabel *)operator_new(0x30);
  TextLabel::TextLabel(pTVar6,&this->q->super_QWidget,(WindowFlags)0x0);
  this->detailedTextLabel = pTVar6;
  QFont::QFont(local_40,(QFont *)(*(long *)&pTVar6->field_0x20 + 0x38));
  QFont::pointSize();
  QFont::setPointSize((int)local_40);
  TextLabel::setFont(this->detailedTextLabel,local_40);
  TextLabel::textOption((TextLabel *)local_30);
  local_30[0] = (QFrame)((byte)local_30[0] | 0x80);
  TextLabel::setTextOption(this->detailedTextLabel,(QTextOption *)local_30);
  this->layout->detailedTextLabel = this->detailedTextLabel;
  QLayout::update();
  QTextOption::~QTextOption((QTextOption *)local_30);
  QFont::~QFont(local_40);
  pQVar7 = (QWidget *)operator_new(0x28);
  QWidget::QWidget(pQVar7,this->q,0);
  this->accessoryWidget = pQVar7;
  this->layout->accessoryWidget = pQVar7;
  iVar4 = QLayout::update();
  return iVar4;
}

Assistant:

void
TableViewCellPrivate::init()
{
	q->setMinimumHeight( FingerGeometry::height() );
	q->setSizePolicy( QSizePolicy::Minimum, QSizePolicy::Fixed );
	q->setBackgroundRole( QPalette::Base );
	q->setAutoFillBackground( true );

	highlightColor = q->palette().color( QPalette::Highlight );
	highlightColor.setAlpha( 75 );


	layout = new TableViewCellLayout( q );
	layout->setContentsMargins( 3, 3, 3, 3 );

	imageLabel = new MinimumSizeLabel( q );
	imageLabel->setAlignment( Qt::AlignCenter );
	imageLabel->setWordWrap( true );
	layout->setImageLabel( imageLabel );

	{
		textLabel = new TextLabel( q );
		QTextOption opt = textLabel->textOption();
		opt.setAlignment( Qt::AlignVCenter | opt.alignment() );
		textLabel->setTextOption( opt );
		layout->setTextLabel( textLabel );
	}

	{
		detailedTextLabel = new TextLabel( q );
		QFont f = detailedTextLabel->font();
		f.setPointSize( qMax( f.pointSize() - 1, 5 ) );
		detailedTextLabel->setFont( f );
		QTextOption opt = detailedTextLabel->textOption();
		opt.setAlignment( Qt::AlignVCenter | opt.alignment() );
		detailedTextLabel->setTextOption( opt );
		layout->setDetailedTextLabel( detailedTextLabel );
	}

	accessoryWidget = new QWidget( q );
	layout->setAccessoryWidget( accessoryWidget );
}